

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

Matrix<double,_3,_3> *
gl4cts::Math::inverse<3>(Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_3> *matrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  GLuint c;
  double *pdVar6;
  ulong uVar7;
  Matrix<double,_3,_3> *pMVar8;
  Matrix<double,_3,_3> *pMVar9;
  long lVar10;
  int row;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double *pdVar14;
  int col;
  Vector<double,_3> *pVVar15;
  GLuint c_1;
  Matrix<double,_3,_3> *pMVar16;
  ulong uVar17;
  GLuint r_1;
  ulong uVar18;
  bool bVar19;
  undefined8 uVar20;
  double dVar21;
  Matrix<double,_3,_3> adjugate;
  Matrix<double,_3,_3> cof;
  double adStack_d0 [3];
  Matrix<double,_3,_3> local_b8;
  double local_68 [10];
  
  pMVar8 = &local_b8;
  pMVar9 = &local_b8;
  pdVar6 = local_68;
  local_68[6] = 0.0;
  local_68[7] = 0.0;
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[8] = 0.0;
  lVar10 = 0;
  lVar11 = 0;
  do {
    lVar12 = 0;
    do {
      uVar20 = 0x3ff0000000000000;
      if (lVar10 != lVar12) {
        uVar20 = 0;
      }
      *(undefined8 *)((long)pdVar6 + lVar12) = uVar20;
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0x48);
    lVar11 = lVar11 + 1;
    pdVar6 = pdVar6 + 1;
    lVar10 = lVar10 + 0x18;
  } while (lVar11 != 3);
  uVar7 = 0;
  do {
    uVar13 = 0;
    do {
      local_b8.m_data.m_data[0].m_data[2] = 0.0;
      local_b8.m_data.m_data[1].m_data[0] = 0.0;
      local_b8.m_data.m_data[0].m_data[0] = 0.0;
      local_b8.m_data.m_data[0].m_data[1] = 0.0;
      lVar11 = 0;
      pMVar16 = &local_b8;
      lVar10 = 0;
      do {
        lVar12 = 0;
        do {
          uVar20 = 0x3ff0000000000000;
          if (lVar11 != lVar12) {
            uVar20 = 0;
          }
          *(undefined8 *)((long)pMVar16 + lVar12) = uVar20;
          lVar12 = lVar12 + 0x10;
        } while (lVar12 == 0x10);
        pMVar16 = (Matrix<double,_3,_3> *)((long)pMVar16 + 8);
        lVar11 = lVar11 + 0x10;
        bVar19 = lVar10 == 0;
        lVar10 = lVar10 + 1;
      } while (bVar19);
      uVar17 = 0;
      pVVar15 = (Vector<double,_3> *)matrix;
      do {
        if (uVar17 != uVar7) {
          uVar18 = 0;
          do {
            if (uVar13 != uVar18) {
              local_b8.m_data.m_data[0].m_data
              [(long)(int)((int)uVar17 - (uint)(uVar7 < uVar17)) * 2 +
               (long)(int)((int)uVar18 - (uint)(uVar13 < uVar18))] =
                   ((Vector<tcu::Vector<double,_3>,_3> *)pVVar15->m_data)->m_data[0].m_data[uVar18];
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != 3);
        }
        uVar17 = uVar17 + 1;
        pVVar15 = pVVar15 + 1;
      } while (uVar17 != 3);
      dVar21 = local_b8.m_data.m_data[0].m_data[0] * local_b8.m_data.m_data[1].m_data[0] -
               local_b8.m_data.m_data[0].m_data[2] * local_b8.m_data.m_data[0].m_data[1];
      if (((int)uVar13 + (int)uVar7 & 1U) != 0) {
        dVar21 = -dVar21;
      }
      local_68[uVar7 * 3 + uVar13] = dVar21;
      uVar13 = uVar13 + 1;
    } while (uVar13 != 3);
    uVar7 = uVar7 + 1;
  } while (uVar7 != 3);
  local_b8.m_data.m_data[2].m_data[0] = 0.0;
  local_b8.m_data.m_data[2].m_data[1] = 0.0;
  local_b8.m_data.m_data[1].m_data[1] = 0.0;
  local_b8.m_data.m_data[1].m_data[2] = 0.0;
  local_b8.m_data.m_data[0].m_data[2] = 0.0;
  local_b8.m_data.m_data[1].m_data[0] = 0.0;
  local_b8.m_data.m_data[0].m_data[0] = 0.0;
  local_b8.m_data.m_data[0].m_data[1] = 0.0;
  local_b8.m_data.m_data[2].m_data[2] = 0.0;
  lVar10 = 0;
  lVar11 = 0;
  do {
    lVar12 = 0;
    do {
      uVar20 = 0x3ff0000000000000;
      if (lVar10 != lVar12) {
        uVar20 = 0;
      }
      *(undefined8 *)((long)pMVar8 + lVar12) = uVar20;
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0x48);
    lVar11 = lVar11 + 1;
    pMVar8 = (Matrix<double,_3,_3> *)((long)pMVar8 + 8);
    lVar10 = lVar10 + 0x18;
  } while (lVar11 != 3);
  pdVar6 = local_68;
  lVar10 = 0;
  do {
    lVar11 = 0;
    pdVar14 = pdVar6;
    do {
      *(double *)((long)pMVar9 + lVar11 * 8) = *pdVar14;
      lVar11 = lVar11 + 1;
      pdVar14 = pdVar14 + 3;
    } while (lVar11 != 3);
    lVar10 = lVar10 + 1;
    pMVar9 = (Matrix<double,_3,_3> *)((long)pMVar9 + 0x18);
    pdVar6 = pdVar6 + 1;
  } while (lVar10 != 3);
  dVar21 = (matrix->m_data).m_data[1].m_data[1];
  dVar1 = (matrix->m_data).m_data[2].m_data[1];
  dVar2 = (matrix->m_data).m_data[0].m_data[1];
  dVar3 = (matrix->m_data).m_data[0].m_data[2];
  dVar4 = (matrix->m_data).m_data[1].m_data[2];
  dVar5 = (matrix->m_data).m_data[2].m_data[2];
  tcu::operator*(__return_storage_ptr__,&local_b8,
                 1.0 / ((dVar2 * dVar4 - dVar21 * dVar3) * (matrix->m_data).m_data[2].m_data[0] +
                       ((dVar21 * dVar5 - dVar1 * dVar4) * (matrix->m_data).m_data[0].m_data[0] -
                       (dVar5 * dVar2 - dVar1 * dVar3) * (matrix->m_data).m_data[1].m_data[0])));
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Size, Size> inverse(const tcu::Matrix<glw::GLdouble, Size, Size>& matrix)
{
	const tcu::Matrix<glw::GLdouble, Size, Size> cof	  = cofactors(matrix);
	const tcu::Matrix<glw::GLdouble, Size, Size> adjugate = tcu::transpose(cof);
	const glw::GLdouble det		= determinant(matrix);
	const glw::GLdouble inv_det = 1.0 / det;

	tcu::Matrix<glw::GLdouble, Size, Size> result = adjugate * inv_det;

	return result;
}